

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

Logon * SuiteSessionTests::createFIX40Logon
                  (Logon *__return_storage_ptr__,char *sender,char *target,int seq)

{
  INT local_84;
  FieldBase local_80;
  
  FIX40::Logon::Logon(__return_storage_ptr__);
  local_84 = 0;
  FIX::EncryptMethod::EncryptMethod((EncryptMethod *)&local_80,&local_84);
  FIX40::Logon::set(__return_storage_ptr__,(EncryptMethod *)&local_80);
  FIX::FieldBase::~FieldBase(&local_80);
  local_84 = 0x1e;
  FIX::HeartBtInt::HeartBtInt((HeartBtInt *)&local_80,&local_84);
  FIX40::Logon::set(__return_storage_ptr__,(HeartBtInt *)&local_80);
  FIX::FieldBase::~FieldBase(&local_80);
  fillHeader((Header *)&(__return_storage_ptr__->super_Message).field_0x70,sender,target,seq);
  return __return_storage_ptr__;
}

Assistant:

FIX40::Logon createFIX40Logon( const char* sender, const char* target, int seq )
{
  FIX40::Logon logon;
  logon.set( EncryptMethod( 0 ) );
  logon.set( HeartBtInt( 30 ) );
  fillHeader( logon.getHeader(), sender, target, seq );
  return logon;
}